

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x8fb,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2>, unsigned int>, Key<2>::Hash, phmap::EqualTo<Key<2>>, std::allocator<std::pair<const Key<2>, unsigned int>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<Key<2>, unsigned int>, Hash = Key<2>::Hash, Eq = phmap::EqualTo<Key<2>>, Alloc = std::allocator<std::pair<const Key<2>, unsigned int>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h) {
        assert(i < capacity_);

        if (IsFull(h)) {
            SanitizerUnpoisonObject(slots_ + i);
        } else {
            SanitizerPoisonObject(slots_ + i);
        }

        ctrl_[i] = h;
        ctrl_[((i - Group::kWidth) & capacity_) + 1 +
              ((Group::kWidth - 1) & capacity_)] = h;
    }